

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

DescriptorFlags __thiscall
Js::DictionaryTypeHandlerBase<int>::GetSetterFromDescriptor<true>
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,
          DictionaryPropertyDescriptor<int> *descriptor,Var *setterValue,PropertyValueInfo *info)

{
  int iVar1;
  Var pvVar2;
  PropertyValueInfo *info_local;
  Var *setterValue_local;
  DictionaryPropertyDescriptor<int> *descriptor_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<int> *this_local;
  
  if ((descriptor->Attributes & 8) == 0) {
    iVar1 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<true>(descriptor);
    if (iVar1 == -1) {
      iVar1 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(descriptor);
      if (iVar1 == -1) {
        this_local._4_4_ = None;
      }
      else {
        iVar1 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(descriptor);
        pvVar2 = DynamicObject::GetSlot(instance,iVar1);
        *setterValue = pvVar2;
        iVar1 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(descriptor);
        SetPropertyValueInfoNonFixed
                  (this,info,&instance->super_RecyclableObject,iVar1,descriptor->Attributes,
                   InlineCacheSetterFlag);
        this_local._4_4_ = Accessor;
      }
    }
    else if ((descriptor->Attributes & 0x10) == 0) {
      if ((descriptor->Attributes & 4) == 0) {
        if ((descriptor->Attributes & 0x80) == 0) {
          this_local._4_4_ = Data;
        }
        else {
          this_local._4_4_ = Const|Data;
        }
      }
      else {
        this_local._4_4_ = WritableData;
      }
    }
    else {
      this_local._4_4_ = WritableData;
      if ((descriptor->Attributes & 0x80) != 0) {
        this_local._4_4_ = Const|Data;
      }
    }
  }
  else {
    this_local._4_4_ = None;
  }
  return this_local._4_4_;
}

Assistant:

DescriptorFlags DictionaryTypeHandlerBase<T>::GetSetterFromDescriptor(DynamicObject* instance, DictionaryPropertyDescriptor<T> * descriptor, Var* setterValue, PropertyValueInfo* info)
    {
        if (descriptor->Attributes & PropertyDeleted)
        {
            return None;
        }
        if (descriptor->template GetDataPropertyIndex<allowLetConstGlobal>() != NoSlots)
        {
            // not a setter but shadows
            if (allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
            {
                return (descriptor->Attributes & PropertyConst) ? (DescriptorFlags)(Const | Data) : WritableData;
            }
            if (descriptor->Attributes & PropertyWritable)
            {
                return WritableData;
            }
            if (descriptor->Attributes & PropertyConst)
            {
                return (DescriptorFlags)(Const | Data);
            }
            return Data;
        }
        else if (descriptor->GetSetterPropertyIndex() != NoSlots)
        {
            *setterValue = ((DynamicObject*)instance)->GetSlot(descriptor->GetSetterPropertyIndex());
            SetPropertyValueInfoNonFixed(info, instance, descriptor->GetSetterPropertyIndex(), descriptor->Attributes, InlineCacheSetterFlag);
            return Accessor;
        }
        return None;
    }